

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O2

pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
* __thiscall
AddrManImpl::SelectTriedCollision_
          (pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
           *__return_storage_ptr__,AddrManImpl *this)

{
  unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
  *this_00;
  int bucket;
  uint uVar1;
  difference_type __d;
  unsigned_long uVar2;
  size_type sVar3;
  mapped_type *pmVar4;
  long in_FS_OFFSET;
  nid_type id_new;
  iterator it;
  key_type_conflict4 local_48;
  const_iterator local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = (this->m_tried_collisions)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (uVar2 == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_006ab3f7;
    std::
    pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::
    pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>,_true>
              (__return_storage_ptr__);
  }
  else {
    local_40._M_node =
         (this->m_tried_collisions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    uVar2 = RandomMixin<FastRandomContext>::randrange<unsigned_long>
                      (&(this->insecure_rand).super_RandomMixin<FastRandomContext>,uVar2);
    std::__advance<std::_Rb_tree_const_iterator<long>,long>(&local_40,uVar2);
    local_48 = *(key_type_conflict4 *)(local_40._M_node + 1);
    this_00 = &this->mapInfo;
    sVar3 = std::
            _Hashtable<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::count(&this_00->_M_h,&local_48);
    if (sVar3 == 1) {
      pmVar4 = std::__detail::
               _Map_base<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,&local_48);
      bucket = AddrInfo::GetTriedBucket(pmVar4,&this->nKey,this->m_netgroupman);
      uVar1 = AddrInfo::GetBucketPosition(pmVar4,&this->nKey,false,bucket);
      pmVar4 = std::__detail::
               _Map_base<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<long,_std::pair<const_long,_AddrInfo>,_std::allocator<std::pair<const_long,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_00,
                            (key_type *)
                            ((long)this->vvTried[0] + (ulong)uVar1 * 8 + (ulong)(uint)(bucket << 9))
                           );
      std::
      pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
      ::pair<const_AddrInfo_&,_true>(__return_storage_ptr__,pmVar4,&pmVar4->m_last_try);
    }
    else {
      std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
      erase_abi_cxx11_((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>
                        *)&this->m_tried_collisions,local_40);
      std::
      pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
      ::
      pair<CAddress,_std::chrono::time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>,_true>
                (__return_storage_ptr__);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_006ab3f7:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<CAddress, NodeSeconds> AddrManImpl::SelectTriedCollision_()
{
    AssertLockHeld(cs);

    if (m_tried_collisions.size() == 0) return {};

    std::set<nid_type>::iterator it = m_tried_collisions.begin();

    // Selects a random element from m_tried_collisions
    std::advance(it, insecure_rand.randrange(m_tried_collisions.size()));
    nid_type id_new = *it;

    // If id_new not found in mapInfo remove it from m_tried_collisions
    if (mapInfo.count(id_new) != 1) {
        m_tried_collisions.erase(it);
        return {};
    }

    const AddrInfo& newInfo = mapInfo[id_new];

    // which tried bucket to move the entry to
    int tried_bucket = newInfo.GetTriedBucket(nKey, m_netgroupman);
    int tried_bucket_pos = newInfo.GetBucketPosition(nKey, false, tried_bucket);

    const AddrInfo& info_old = mapInfo[vvTried[tried_bucket][tried_bucket_pos]];
    return {info_old, info_old.m_last_try};
}